

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
::
sax_parse_internal<nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
          (parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
           *this,json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *sax)

{
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  token_type tVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  undefined **ppuVar8;
  bool bVar9;
  string local_110;
  string local_f0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_88;
  vector<bool,_std::allocator<bool>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00 = (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)(this + 0x28);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x70);
LAB_00109757:
  switch(*(undefined4 *)(this + 0x20)) {
  case 1:
    local_b0[0] = 1;
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<bool&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(bool *)local_b0,false);
    break;
  case 2:
    local_b0._0_8_ = (ulong)(uint7)local_b0._1_7_ << 8;
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<bool&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(bool *)local_b0,false);
    break;
  case 3:
    local_b0._0_8_ = (undefined **)0x0;
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<decltype(nullptr)>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(void **)local_b0,false);
    break;
  case 4:
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<std::__cxx11::string&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,local_38,false);
    break;
  case 5:
    local_b0._0_8_ = *(undefined8 *)(this + 0xa0);
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<unsigned_long&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(unsigned_long *)local_b0,false);
    break;
  case 6:
    local_b0._0_8_ = *(undefined8 *)(this + 0x98);
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<long&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(long *)local_b0,false);
    break;
  case 7:
    if (0x7fefffffffffffff < ((ulong)*(undefined ***)(this + 0xa8) & 0x7fffffffffffffff)) {
      sVar2 = *(size_t *)(this + 0x40);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_b0,this_00);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string(&local_88,this_00);
      std::operator+(&local_110,"number overflow parsing \'",&local_88);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0.field_2._8_8_ = plVar5[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar7;
        local_f0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_f0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      out_of_range::create((out_of_range *)local_d0,0x196,&local_f0);
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(sax,sVar2,(string *)local_b0,(exception *)local_d0);
      local_d0._0_8_ = &PTR__exception_00122a90;
      std::runtime_error::~runtime_error((runtime_error *)(local_d0 + 0x10));
      std::exception::~exception((exception *)local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      ppuVar8 = (undefined **)local_b0._0_8_;
      if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) goto LAB_00109c7e;
      goto LAB_00109c76;
    }
    local_b0._0_8_ = *(undefined ***)(this + 0xa8);
    json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::handle_value<double&>
              ((json_sax_dom_callback_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                *)sax,(double *)local_b0,false);
    break;
  case 8:
    bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::start_array(sax,0xffffffffffffffff);
    if (!bVar3) {
LAB_00109caf:
      bVar3 = false;
      goto LAB_00109c7e;
    }
    tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    *(token_type *)(this + 0x20) = tVar4;
    if (tVar4 == end_array) {
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::end_array(sax);
LAB_0010984c:
      if (bVar3 != false) break;
      goto LAB_00109caf;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&local_60,true);
    goto LAB_00109757;
  case 9:
    bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::start_object(sax,0xffffffffffffffff);
    if (!bVar3) goto LAB_00109caf;
    tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    *(token_type *)(this + 0x20) = tVar4;
    if (tVar4 == end_object) {
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::end_object(sax);
      goto LAB_0010984c;
    }
    if (tVar4 == value_string) {
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::key(sax,local_38);
      if (!bVar3) goto LAB_00109caf;
      tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      *(token_type *)(this + 0x20) = tVar4;
      if (tVar4 == name_separator) {
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_60,false);
        tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(this_00);
        goto LAB_00109a73;
      }
      sVar2 = *(size_t *)(this + 0x40);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_d0,this_00);
      local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
      local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
      local_88._M_string_length = *(size_type *)(this + 0x48);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"object separator","");
      parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::exception_message(&local_f0,
                          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)this,name_separator,&local_110);
      parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
    }
    else {
      sVar2 = *(size_t *)(this + 0x40);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_d0,this_00);
      local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
      local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
      local_88._M_string_length = *(size_type *)(this + 0x48);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"object key","");
      parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::exception_message(&local_f0,
                          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)this,value_string,&local_110);
      parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
    }
    goto LAB_00109c10;
  default:
    goto switchD_0010976e_caseD_a;
  case 0xe:
    sVar2 = *(size_t *)(this + 0x40);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string((string *)local_d0,this_00);
    local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
    local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
    local_88._M_string_length = *(size_type *)(this + 0x48);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"value","");
    parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::exception_message(&local_f0,
                        (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)this,uninitialized,&local_110);
    parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
    bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
    goto LAB_00109c10;
  }
  bVar9 = local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p ==
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p;
  bVar3 = true;
LAB_001098e4:
  if ((bool)(bVar9 & local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0))
  goto LAB_00109c7e;
  uVar1 = (ulong)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
  uVar6 = (ulong)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
  if (-1 < (long)uVar1) {
    uVar6 = uVar1;
  }
  if ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p
       [((long)uVar6 >> 6) + ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
       (uVar1 & 0x3f) & 1) == 0) {
    tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    *(token_type *)(this + 0x20) = tVar4;
    if (tVar4 == value_separator) {
      tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      *(token_type *)(this + 0x20) = tVar4;
      if (tVar4 != value_string) {
        sVar2 = *(size_t *)(this + 0x40);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_d0,this_00);
        local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
        local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
        local_88._M_string_length = *(size_type *)(this + 0x48);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"object key","");
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::exception_message(&local_f0,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)this,value_string,&local_110);
        parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
        bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
        goto LAB_00109c10;
      }
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::key(sax,local_38);
      if (!bVar3) goto LAB_00109caf;
      tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
      *(token_type *)(this + 0x20) = tVar4;
      if (tVar4 != name_separator) {
        sVar2 = *(size_t *)(this + 0x40);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_d0,this_00);
        local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
        local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
        local_88._M_string_length = *(size_type *)(this + 0x48);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"object separator","");
        parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::exception_message(&local_f0,
                            (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)this,name_separator,&local_110);
        parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
        bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
        goto LAB_00109c10;
      }
LAB_00109a6b:
      tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::scan(this_00);
LAB_00109a73:
      *(token_type *)(this + 0x20) = tVar4;
      goto LAB_00109757;
    }
    if (tVar4 != end_object) {
      sVar2 = *(size_t *)(this + 0x40);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_d0,this_00);
      local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
      local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
      local_88._M_string_length = *(size_type *)(this + 0x48);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"object","");
      parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::exception_message(&local_f0,
                          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)this,end_object,&local_110);
      parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
      goto LAB_00109c10;
    }
    bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::end_object(sax);
    if (!bVar9) goto LAB_00109caf;
    if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset == 0 &&
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p ==
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p) {
      __assert_fail("not states.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nowar-fonts[P]otfcc-quad2cubic/include/nlohmann/detail/input/parser.hpp"
                    ,0x1b6,
                    "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(SAX *) [BasicJsonType = nlohmann::basic_json<>, SAX = nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>]"
                   );
    }
  }
  else {
    tVar4 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(this_00);
    *(token_type *)(this + 0x20) = tVar4;
    if (tVar4 == value_separator) goto LAB_00109a6b;
    if (tVar4 != end_array) {
      sVar2 = *(size_t *)(this + 0x40);
      lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::get_token_string((string *)local_d0,this_00);
      local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
      local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
      local_88._M_string_length = *(size_type *)(this + 0x48);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"array","");
      parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::exception_message(&local_f0,
                          (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)this,end_array,&local_110);
      parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
      bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
      goto LAB_00109c10;
    }
    bVar9 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::end_array(sax);
    if (!bVar9) goto LAB_00109caf;
    if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset == 0 &&
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p ==
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p) {
      __assert_fail("not states.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nowar-fonts[P]otfcc-quad2cubic/include/nlohmann/detail/input/parser.hpp"
                    ,0x17e,
                    "bool nlohmann::detail::parser<nlohmann::basic_json<>>::sax_parse_internal(SAX *) [BasicJsonType = nlohmann::basic_json<>, SAX = nlohmann::detail::json_sax_dom_callback_parser<nlohmann::basic_json<>>]"
                   );
    }
  }
  bVar9 = local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset == 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset =
       local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset - 1;
  if (bVar9) {
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0x3f;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p + -1;
  }
  bVar9 = local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p ==
          local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p;
  goto LAB_001098e4;
switchD_0010976e_caseD_a:
  sVar2 = *(size_t *)(this + 0x40);
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::get_token_string((string *)local_d0,this_00);
  local_88.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x50);
  local_88._M_dataplus._M_p = *(pointer *)(this + 0x40);
  local_88._M_string_length = *(size_type *)(this + 0x48);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"value","");
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::exception_message(&local_f0,
                      (parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)this,literal_or_value,&local_110);
  parse_error::create((parse_error *)local_b0,0x65,(position_t *)&local_88,&local_f0);
  bVar3 = json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::parse_error(sax,sVar2,(string *)local_d0,(exception *)local_b0);
LAB_00109c10:
  local_b0._0_8_ = &PTR__exception_00122a90;
  std::runtime_error::~runtime_error((runtime_error *)(local_b0 + 0x10));
  std::exception::~exception((exception *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_allocated_capacity = local_c0._M_allocated_capacity;
  ppuVar8 = (undefined **)local_d0._0_8_;
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
LAB_00109c76:
    operator_delete(ppuVar8,local_a0._M_allocated_capacity + 1);
  }
LAB_00109c7e:
  if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar3;
}

Assistant:

bool sax_parse_internal(SAX* sax)
    {
        // stack to remember the hierarchy of structured values we are parsing
        // true = array; false = object
        std::vector<bool> states;
        // value to avoid a goto (see comment where set to true)
        bool skip_to_state_evaluation = false;

        while (true)
        {
            if (not skip_to_state_evaluation)
            {
                // invariant: get_token() was called before each iteration
                switch (last_token)
                {
                    case token_type::begin_object:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->start_object(std::size_t(-1))))
                        {
                            return false;
                        }

                        // closing } -> we are done
                        if (get_token() == token_type::end_object)
                        {
                            if (JSON_HEDLEY_UNLIKELY(not sax->end_object()))
                            {
                                return false;
                            }
                            break;
                        }

                        // parse key
                        if (JSON_HEDLEY_UNLIKELY(last_token != token_type::value_string))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(),
                                                            exception_message(token_type::value_string, "object key")));
                        }
                        if (JSON_HEDLEY_UNLIKELY(not sax->key(m_lexer.get_string())))
                        {
                            return false;
                        }

                        // parse separator (:)
                        if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::name_separator))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    parse_error::create(101, m_lexer.get_position(),
                                                            exception_message(token_type::name_separator, "object separator")));
                        }

                        // remember we are now inside an object
                        states.push_back(false);

                        // parse values
                        get_token();
                        continue;
                    }

                    case token_type::begin_array:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->start_array(std::size_t(-1))))
                        {
                            return false;
                        }

                        // closing ] -> we are done
                        if (get_token() == token_type::end_array)
                        {
                            if (JSON_HEDLEY_UNLIKELY(not sax->end_array()))
                            {
                                return false;
                            }
                            break;
                        }

                        // remember we are now inside an array
                        states.push_back(true);

                        // parse values (no need to call get_token)
                        continue;
                    }

                    case token_type::value_float:
                    {
                        const auto res = m_lexer.get_number_float();

                        if (JSON_HEDLEY_UNLIKELY(not std::isfinite(res)))
                        {
                            return sax->parse_error(m_lexer.get_position(),
                                                    m_lexer.get_token_string(),
                                                    out_of_range::create(406, "number overflow parsing '" + m_lexer.get_token_string() + "'"));
                        }

                        if (JSON_HEDLEY_UNLIKELY(not sax->number_float(res, m_lexer.get_string())))
                        {
                            return false;
                        }

                        break;
                    }

                    case token_type::literal_false:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->boolean(false)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_null:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->null()))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::literal_true:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->boolean(true)))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_integer:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->number_integer(m_lexer.get_number_integer())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_string:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->string(m_lexer.get_string())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::value_unsigned:
                    {
                        if (JSON_HEDLEY_UNLIKELY(not sax->number_unsigned(m_lexer.get_number_unsigned())))
                        {
                            return false;
                        }
                        break;
                    }

                    case token_type::parse_error:
                    {
                        // using "uninitialized" to avoid "expected" message
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::uninitialized, "value")));
                    }

                    default: // the last token was unexpected
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::literal_or_value, "value")));
                    }
                }
            }
            else
            {
                skip_to_state_evaluation = false;
            }

            // we reached this line after we successfully parsed a value
            if (states.empty())
            {
                // empty stack: we reached the end of the hierarchy: done
                return true;
            }

            if (states.back())  // array
            {
                // comma -> next value
                if (get_token() == token_type::value_separator)
                {
                    // parse a new value
                    get_token();
                    continue;
                }

                // closing ]
                if (JSON_HEDLEY_LIKELY(last_token == token_type::end_array))
                {
                    if (JSON_HEDLEY_UNLIKELY(not sax->end_array()))
                    {
                        return false;
                    }

                    // We are done with this array. Before we can parse a
                    // new value, we need to evaluate the new state first.
                    // By setting skip_to_state_evaluation to false, we
                    // are effectively jumping to the beginning of this if.
                    assert(not states.empty());
                    states.pop_back();
                    skip_to_state_evaluation = true;
                    continue;
                }

                return sax->parse_error(m_lexer.get_position(),
                                        m_lexer.get_token_string(),
                                        parse_error::create(101, m_lexer.get_position(),
                                                exception_message(token_type::end_array, "array")));
            }
            else  // object
            {
                // comma -> next value
                if (get_token() == token_type::value_separator)
                {
                    // parse key
                    if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::value_string))
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::value_string, "object key")));
                    }

                    if (JSON_HEDLEY_UNLIKELY(not sax->key(m_lexer.get_string())))
                    {
                        return false;
                    }

                    // parse separator (:)
                    if (JSON_HEDLEY_UNLIKELY(get_token() != token_type::name_separator))
                    {
                        return sax->parse_error(m_lexer.get_position(),
                                                m_lexer.get_token_string(),
                                                parse_error::create(101, m_lexer.get_position(),
                                                        exception_message(token_type::name_separator, "object separator")));
                    }

                    // parse values
                    get_token();
                    continue;
                }

                // closing }
                if (JSON_HEDLEY_LIKELY(last_token == token_type::end_object))
                {
                    if (JSON_HEDLEY_UNLIKELY(not sax->end_object()))
                    {
                        return false;
                    }

                    // We are done with this object. Before we can parse a
                    // new value, we need to evaluate the new state first.
                    // By setting skip_to_state_evaluation to false, we
                    // are effectively jumping to the beginning of this if.
                    assert(not states.empty());
                    states.pop_back();
                    skip_to_state_evaluation = true;
                    continue;
                }

                return sax->parse_error(m_lexer.get_position(),
                                        m_lexer.get_token_string(),
                                        parse_error::create(101, m_lexer.get_position(),
                                                exception_message(token_type::end_object, "object")));
            }
        }
    }